

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_138e242::NotInProjectDir::operator()(NotInProjectDir *this,string *p)

{
  bool bVar1;
  path pStack_a8;
  cmCMakePath path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  path local_38;
  
  std::__cxx11::string::string((string *)&local_58,(string *)p);
  cmCMakePath::cmCMakePath<std::__cxx11::string,cmCMakePath&>
            ((cmCMakePath *)&pStack_a8,&local_58,generic_format);
  cmCMakePath::Normal(&path,(cmCMakePath *)&pStack_a8);
  std::filesystem::__cxx11::path::~path(&pStack_a8);
  std::__cxx11::string::~string((string *)&local_58);
  bVar1 = std::filesystem::__cxx11::path::is_relative(&path.Path);
  if (bVar1) {
    bVar1 = false;
  }
  else {
    cmCMakePath::cmCMakePath((cmCMakePath *)&pStack_a8,this->SourceDir,generic_format);
    bVar1 = cmCMakePath::IsPrefix((cmCMakePath *)&pStack_a8,&path);
    if (bVar1) {
      bVar1 = false;
    }
    else {
      cmCMakePath::cmCMakePath((cmCMakePath *)&local_38,this->BinaryDir,generic_format);
      bVar1 = cmCMakePath::IsPrefix((cmCMakePath *)&local_38,&path);
      bVar1 = !bVar1;
      std::filesystem::__cxx11::path::~path(&local_38);
    }
    std::filesystem::__cxx11::path::~path(&pStack_a8);
  }
  std::filesystem::__cxx11::path::~path(&path.Path);
  return bVar1;
}

Assistant:

bool operator()(const std::string& p) const
  {
    auto path = cmCMakePath(p).Normal();

    // Keep all relative paths:
    if (path.IsRelative()) {
      return false;
    }

    // If it's an absolute path, check if it starts with the source
    // directory:
    return !(cmCMakePath(this->SourceDir).IsPrefix(path) ||
             cmCMakePath(this->BinaryDir).IsPrefix(path));
  }